

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

void __thiscall
event_track::ingest_event_stream::write_to_dash_event_stream
          (ingest_event_stream *this,string *out_file)

{
  char cVar1;
  uint32_t uVar2;
  int iVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Self __tmp;
  string scheme_id_uri;
  ofstream ot;
  string local_288;
  char *local_268;
  long local_260;
  char local_258 [16];
  ulong local_248;
  _Rb_tree_node_base *local_240;
  _Rb_tree_node_base *local_238;
  long local_230;
  filebuf local_228 [24];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)out_file,_S_out);
  if (*(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18)) == 0) {
    uVar2 = fmp4_stream::init_fragment::get_time_scale((init_fragment *)this);
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
    p_Var6 = *(_Rb_tree_node_base **)&this->field_0x238;
    local_240 = (_Rb_tree_node_base *)&this->field_0x228;
    if (p_Var6 != local_240) {
      local_248 = (ulong)uVar2;
      do {
        std::__cxx11::string::_M_assign((string *)&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"<EventStream ",0xd);
        cVar1 = (char)(ostream *)&local_230;
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        iVar3 = std::__cxx11::string::compare((char *)&local_268);
        if (iVar3 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"schemeIdUri=",0xc);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(char *)&local_288,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"urn:scte:scte35:2014:xml+bin",0x1c);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"schemeIdUri=",0xc);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(char *)&local_288,1);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_268,local_260);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," timescale=",0xb);
        local_288._M_dataplus._M_p._0_1_ = 0x22;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(char *)&local_288,1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        local_288._M_dataplus._M_p._0_1_ = 0x22;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        local_238 = p_Var6;
        for (p_Var5 = p_Var6[2]._M_right; p_Var5 != (_Rb_tree_node_base *)&p_Var6[2]._M_parent;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," writing an event to output ",0x1c);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"<Event ",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,"presentationTime=",0x11);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,(char *)&local_288,1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"duration=",9);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"id=",3);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          local_288._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1);
          iVar3 = std::__cxx11::string::compare((char *)&p_Var5[5]._M_parent);
          if (iVar3 == 0) {
            local_288._M_dataplus._M_p._0_1_ = 0x3e;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,(char *)&local_288,1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  <Signal xmlns=",0x10);
            local_288._M_dataplus._M_p._0_1_ = 0x22;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"http://www.scte.org/schemas/35/2016",0x23);
            local_288._M_dataplus._M_p._0_1_ = 0x22;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1)
            ;
            local_288._M_dataplus._M_p._0_1_ = 0x3e;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    <Binary>",0xc);
            base64_encode_abi_cxx11_
                      (&local_288,(uchar *)p_Var5[7]._M_parent,
                       (ulong)(uint)(*(int *)&p_Var5[7]._M_left - (int)p_Var5[7]._M_parent));
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                        local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</Binary>",9);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  </Signal>",0xb);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,"contentEncoding=",0x10);
            local_288._M_dataplus._M_p._0_1_ = 0x22;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_230,(char *)&local_288,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"base64",6);
            local_288._M_dataplus._M_p._0_1_ = 0x22;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1)
            ;
            local_288._M_dataplus._M_p._0_1_ = 0x3e;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_288,1)
            ;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            base64_encode_abi_cxx11_
                      (&local_288,(uchar *)p_Var5[7]._M_parent,
                       (ulong)(uint)(*(int *)&p_Var5[7]._M_left - (int)p_Var5[7]._M_parent));
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar4,(char *)CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                                        local_288._M_dataplus._M_p._0_1_),
                                local_288._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_288._M_dataplus._M_p._1_7_,local_288._M_dataplus._M_p._0_1_) !=
              &local_288.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_288._M_dataplus._M_p._1_7_,
                                     local_288._M_dataplus._M_p._0_1_));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"</Event>",8);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_238);
      } while (p_Var6 != local_240);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"</EventStream> ",0xf);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    if (local_268 != local_258) {
      operator_delete(local_268);
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void event_track::ingest_event_stream::write_to_dash_event_stream(std::string &out_file)
{
	std::ofstream ot(out_file);

	if (ot.good()) {

		uint32_t time_scale = init_fragment_.get_time_scale();
		std::string scheme_id_uri = "";

		for (auto it = this->events_list_.begin(); it != this->events_list_.end(); ++it)
		{
			scheme_id_uri = it->first;
			ot << "<EventStream " << std::endl;
			if (scheme_id_uri.compare("urn:scte:scte35:2013:bin") == 0) // convert binary scte 214 to xml + bin
			{
				ot << "schemeIdUri=" << '"' << "urn:scte:scte35:2014:xml+bin" << '"' << std::endl;
			}
			else {
				ot << "schemeIdUri=" << '"' << scheme_id_uri << '"' << std::endl;
			}
			ot << " timescale=" << '"' << time_scale << '"' << ">" << std::endl;

			// write each of the event messages as moof mdat combinations in sparse track 
			for (auto it2 = it->second.begin(); it2 != it->second.end(); it2++)
			{
				std::cout << " writing an event to output " << std::endl;
				ot << "<Event "
					<< "presentationTime=" << '"' << it2->second.presentation_time_ << '"' << " "  \
					<< "duration=" << '"' << it2->second.event_duration_<< '"' << " "  \
					<< "id=" << '"' << it2->second.id_ << '"';
				if (it2->second.scheme_id_uri_.compare("urn:scte:scte35:2013:bin") == 0) // write binary scte as xml + bin as defined by scte-35
				{
					ot << '>' << std::endl << "  <Signal xmlns=" << '"' << "http://www.scte.org/schemas/35/2016" << '"' << '>' << std::endl \
						<< "    <Binary>" << base64_encode(it2->second.message_data_.data(), (unsigned int) it2->second.message_data_.size()) << "</Binary>" << std::endl
						<< "  </Signal>" << std::endl;
				}
				else {
					ot << " " << "contentEncoding=" << '"' << "base64" << '"' << '>' << std::endl
						<< base64_encode(it2->second.message_data_.data(), (unsigned int)it2->second.message_data_.size()) << std::endl;
				}
				ot << "</Event>" << std::endl;
			}
			}
			ot << "</EventStream> " << std::endl;
		}

	    ot.close();
	}